

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::MultiplyPropagateStatistics::Operation<int,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  BaseStatistics *pBVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  BaseStatistics *pBVar9;
  BaseStatistics *pBVar10;
  uint uVar11;
  uint uVar12;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  int lvals [2];
  int local_88 [2];
  Value *local_80;
  Value *local_78;
  Value local_70;
  BaseStatistics *pBVar13;
  
  local_80 = new_min;
  local_78 = new_max;
  local_88[0] = NumericStats::GetMin<int>(lstats);
  local_88[1] = NumericStats::GetMax<int>(lstats);
  iVar2 = NumericStats::GetMin<int>(rstats);
  iVar3 = NumericStats::GetMax<int>(rstats);
  uVar8 = 0x7fffffff;
  uVar12 = 0x80000000;
  bVar16 = true;
  lVar6 = 0;
  do {
    pBVar10 = (BaseStatistics *)((long)iVar2 * (long)local_88[lVar6]);
    pBVar1 = pBVar10;
    if ((BaseStatistics *)(long)(int)pBVar10 != pBVar10) {
      pBVar1 = rstats;
    }
    rstats = (BaseStatistics *)((ulong)pBVar1 & 0xffffffff);
    pBVar9 = (BaseStatistics *)(ulong)uVar8;
    if ((int)pBVar1 < (int)uVar8) {
      pBVar9 = rstats;
    }
    pBVar13 = (BaseStatistics *)(ulong)uVar12;
    if ((int)uVar12 < (int)pBVar1) {
      pBVar13 = rstats;
    }
    bVar14 = (undefined1 *)0x773593fe < &pBVar10[0xad6534].field_0x1f;
    uVar4 = (uint)pBVar9;
    if (bVar14) {
      pBVar9 = (BaseStatistics *)(ulong)uVar8;
      uVar4 = uVar8;
    }
    uVar8 = uVar4;
    if (bVar14) {
      bVar14 = false;
    }
    else {
      uVar5 = (long)local_88[lVar6] * (long)iVar3;
      uVar12 = (uint)pBVar13;
      bVar14 = false;
      while (!bVar14) {
        if (uVar5 + 0x80000000 >> 0x20 == 0) {
          rstats = (BaseStatistics *)(uVar5 & 0xffffffff);
        }
        uVar7 = (uint)rstats;
        uVar4 = uVar8;
        if ((int)uVar7 < (int)uVar8) {
          uVar4 = uVar7;
        }
        uVar11 = uVar12;
        if ((int)uVar12 < (int)uVar7) {
          uVar11 = uVar7;
        }
        bVar15 = uVar5 + 999999999 < 1999999999;
        uVar8 = (uint)pBVar9;
        if (bVar15) {
          pBVar9 = (BaseStatistics *)(ulong)uVar4;
          uVar8 = uVar4;
        }
        uVar12 = (uint)pBVar13;
        if (!bVar15) break;
        pBVar13 = (BaseStatistics *)(ulong)uVar11;
        uVar12 = uVar11;
        bVar14 = true;
      }
    }
    if (!bVar14) break;
    bVar16 = lVar6 == 0;
    lVar6 = lVar6 + 1;
  } while (bVar16);
  if (bVar16 == false) {
    Value::Numeric(&local_70,type,(long)(int)uVar8);
    Value::operator=(local_80,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,(long)(int)uVar12);
    Value::operator=(local_78,&local_70);
    Value::~Value(&local_70);
  }
  return bVar16;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}